

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::OptionNotFound::~OptionNotFound(OptionNotFound *this)

{
  size_t in_stack_00000058;
  void *in_stack_00000060;
  OptionNotFound *this_local;
  
  ~OptionNotFound(this);
  operator_delete(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}